

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::addConnection(QObjectPrivate *this,int signal,Connection *c)

{
  uint uVar1;
  QObjectPrivate *this_00;
  Type pCVar2;
  Type pCVar3;
  long *in_RDX;
  Type in_RDI;
  QObjectPrivate *rd;
  ConnectionList *connectionList;
  ConnectionData *cd;
  ConnectionData *in_stack_ffffffffffffffd0;
  QObjectPrivate *in_stack_ffffffffffffffe0;
  
  pCVar2 = in_RDI;
  ensureConnectionData(in_stack_ffffffffffffffe0);
  this_00 = (QObjectPrivate *)
            QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                      ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ff531);
  ConnectionData::resizeSignalVector((ConnectionData *)pCVar2,(size_t)cd);
  ConnectionData::connectionsForSignal(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  pCVar2 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3ff57a);
  if (pCVar2 == (Type)0x0) {
    QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffd0,in_RDI);
  }
  else {
    QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3ff58e);
    QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
              ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffd0,in_RDI);
  }
  uVar1 = QBasicAtomicInteger<unsigned_int>::operator++
                    ((QBasicAtomicInteger<unsigned_int> *)0x3ff5ba);
  *(uint *)((long)in_RDX + 0x4c) = uVar1;
  pCVar2 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3ff5d2);
  in_RDX[3] = (long)pCVar2;
  QBasicAtomicPointer<QObjectPrivate::Connection>::storeRelaxed
            ((QBasicAtomicPointer<QObjectPrivate::Connection> *)in_stack_ffffffffffffffd0,in_RDI);
  QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3ff5ff);
  get((QObject *)0x3ff607);
  ensureConnectionData(this_00);
  pCVar3 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ff624);
  in_RDX[1] = (long)&pCVar3->senders;
  *in_RDX = *(long *)in_RDX[1];
  *(long **)in_RDX[1] = in_RDX;
  if (*in_RDX != 0) {
    *(long **)(*in_RDX + 8) = in_RDX;
  }
  return;
}

Assistant:

inline void QObjectPrivate::addConnection(int signal, Connection *c)
{
    Q_ASSERT(c->sender == q_ptr);
    ensureConnectionData();
    ConnectionData *cd = connections.loadRelaxed();
    cd->resizeSignalVector(signal + 1);

    ConnectionList &connectionList = cd->connectionsForSignal(signal);
    if (connectionList.last.loadRelaxed()) {
        Q_ASSERT(connectionList.last.loadRelaxed()->receiver.loadRelaxed());
        connectionList.last.loadRelaxed()->nextConnectionList.storeRelaxed(c);
    } else {
        connectionList.first.storeRelaxed(c);
    }
    c->id = ++cd->currentConnectionId;
    c->prevConnectionList = connectionList.last.loadRelaxed();
    connectionList.last.storeRelaxed(c);

    QObjectPrivate *rd = QObjectPrivate::get(c->receiver.loadRelaxed());
    rd->ensureConnectionData();

    c->prev = &(rd->connections.loadRelaxed()->senders);
    c->next = *c->prev;
    *c->prev = c;
    if (c->next)
        c->next->prev = &c->next;
}